

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<ReadThreadsGraph,_DistanceGraph> * __thiscall
pybind11::class_<ReadThreadsGraph,DistanceGraph>::
def<std::unordered_set<std::pair<long,int>,std::hash<std::pair<long,int>>,std::equal_to<std::pair<long,int>>,std::allocator<std::pair<long,int>>>(ReadThreadsGraph::*)(long)const,pybind11::arg>
          (class_<ReadThreadsGraph,_DistanceGraph> *this,char *name_,
          offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr *f,arg *extra)

{
  undefined8 *in_RDX;
  sibling *extraout_RDX;
  char *in_RSI;
  handle *in_RDI;
  cpp_function *unaff_retaddr;
  char *in_stack_00000008;
  object *in_stack_00000010;
  cpp_function cf;
  handle *in_stack_ffffffffffffff48;
  sibling *this_00;
  handle in_stack_ffffffffffffff70;
  handle in_stack_ffffffffffffff78;
  is_method *in_stack_ffffffffffffff80;
  name *in_stack_ffffffffffffff88;
  offset_in_vector<unsigned_long,_std::allocator<unsigned_long>_>_to_subr in_stack_ffffffffffffff90;
  PyObject *this_01;
  is_method local_48;
  name in_stack_ffffffffffffffc0;
  
  _ReadThreadsGraph___pybind11__method_adaptor<ReadThreadsGraph,std::unordered_set<std::pair<long,int>,std::hash<std::pair<long,int>>,std::equal_to<std::pair<long,int>>,std::allocator<std::pair<long,int>>>,ReadThreadsGraph,long>_std__unordered_set<std::pair<long,int>,std::hash<std::pair<long,int>>,std::equal_to<std::pair<long,int>>,std::allocator<std::pair<long,int>>>_ReadThreadsGraph_____long_const__
            ((void *)*in_RDX,in_RDX[1]);
  this_00 = extraout_RDX;
  pybind11::name::name((name *)&stack0xffffffffffffffc0,in_RSI);
  is_method::is_method(&local_48,in_RDI);
  this_01 = (((generic_type *)&in_RDI->m_ptr)->super_object).super_handle.m_ptr;
  none::none((none *)in_RDI);
  getattr(in_stack_ffffffffffffff78,in_RSI,in_stack_ffffffffffffff70);
  sibling::sibling(this_00,in_stack_ffffffffffffff48);
  cpp_function::
  cpp_function<std::unordered_set<std::pair<long,int>,std::hash<std::pair<long,int>>,std::equal_to<std::pair<long,int>>,std::allocator<std::pair<long,int>>>,ReadThreadsGraph,long,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg>
            ((cpp_function *)this_01,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,this_00,(arg *)in_stack_ffffffffffffffc0.value);
  object::~object((object *)0x277cd1);
  none::~none((none *)0x277cdb);
  pybind11::detail::add_class_method(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  cpp_function::~cpp_function((cpp_function *)0x277d04);
  return (class_<ReadThreadsGraph,_DistanceGraph> *)in_RDI;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        add_class_method(*this, name_, cf);
        return *this;
    }